

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgDisplay * __thiscall
cimg_library::CImgDisplay::resize(CImgDisplay *this,int nwidth,int nheight,bool force_redraw)

{
  Display *pDVar1;
  int iVar2;
  int iVar3;
  X11_info *pXVar4;
  CImgDisplay *pCVar5;
  uint uVar6;
  uint ndimx;
  bool bVar7;
  bool bVar8;
  
  if (nheight != 0 && nwidth != 0) {
    bVar7 = this->_width == 0;
    bVar8 = this->_height == 0;
    if (-1 < (nheight | nwidth) || !bVar8 && !bVar7) {
      if (bVar8 || bVar7) {
        this = assign(this,nwidth,nheight,(char *)0x0,3,false,false);
      }
      else {
        pXVar4 = cimg::X11_attr();
        pDVar1 = pXVar4->display;
        if (nwidth < 1) {
          nwidth = -(nwidth * this->_width) / 100;
        }
        if (nheight < 1) {
          nheight = -(nheight * this->_height) / 100;
        }
        ndimx = nwidth + (uint)(nwidth == 0);
        uVar6 = nheight + (uint)(nheight == 0);
        XLockDisplay(pDVar1);
        if ((this->_window_width != ndimx) || (this->_window_height != uVar6)) {
          XResizeWindow(pDVar1,this->_window,ndimx,uVar6);
        }
        if ((this->_width != ndimx) || (this->_height != uVar6)) {
          pXVar4 = cimg::X11_attr();
          if (pXVar4->nb_bits == 0x10) {
            _resize<unsigned_short>(this,0,ndimx,uVar6,force_redraw);
          }
          else if (pXVar4->nb_bits == 8) {
            _resize<unsigned_char>(this,'\0',ndimx,uVar6,force_redraw);
          }
          else {
            _resize<unsigned_int>(this,0,ndimx,uVar6,force_redraw);
          }
        }
        this->_width = ndimx;
        this->_window_width = ndimx;
        this->_height = uVar6;
        this->_window_height = uVar6;
        this->_is_resized = false;
        XUnlockDisplay(pDVar1);
        if (this->_is_fullscreen == true) {
          iVar2 = screen_width();
          uVar6 = this->_width;
          iVar3 = screen_height();
          move(this,iVar2 - uVar6 >> 1,iVar3 - this->_height >> 1);
        }
        if (force_redraw) {
          pCVar5 = paint(this,true);
          return pCVar5;
        }
      }
      return this;
    }
  }
  pCVar5 = assign(this);
  return pCVar5;
}

Assistant:

CImgDisplay& resize(const int nwidth, const int nheight, const bool force_redraw=true) {
      if (!nwidth || !nheight || (is_empty() && (nwidth<0 || nheight<0))) return assign();
      if (is_empty()) return assign(nwidth,nheight);
      Display *const dpy = cimg::X11_attr().display;
      const unsigned int
        tmpdimx = (nwidth>0)?nwidth:(-nwidth*_width/100),
        tmpdimy = (nheight>0)?nheight:(-nheight*_height/100),
        dimx = tmpdimx?tmpdimx:1,
        dimy = tmpdimy?tmpdimy:1;
      XLockDisplay(dpy);
      if (_window_width!=dimx || _window_height!=dimy) XResizeWindow(dpy,_window,dimx,dimy);
      if (_width!=dimx || _height!=dimy) switch (cimg::X11_attr().nb_bits) {
        case 8 :  { unsigned char pixel_type = 0; _resize(pixel_type,dimx,dimy,force_redraw); } break;
        case 16 : { unsigned short pixel_type = 0; _resize(pixel_type,dimx,dimy,force_redraw); } break;
        default : { unsigned int pixel_type = 0; _resize(pixel_type,dimx,dimy,force_redraw); }
        }
      _window_width = _width = dimx; _window_height = _height = dimy;
      _is_resized = false;
      XUnlockDisplay(dpy);
      if (_is_fullscreen) move((screen_width()-_width)/2,(screen_height()-_height)/2);
      if (force_redraw) return paint();
      return *this;
    }